

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

ProString * __thiscall
ProString::operator+=(ProString *this,QStringBuilder<ProString_&,_ProString> *other)

{
  long lVar1;
  ProString *pPVar2;
  QString *in_RSI;
  QStringBuilder<ProString_&,_ProString> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QStringBuilder::operator_cast_to_QString(in_RDI);
  pPVar2 = append((ProString *)in_RDI,in_RSI);
  QString::~QString((QString *)0x21d32a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pPVar2;
  }
  __stack_chk_fail();
}

Assistant:

ProString &operator+=(const QStringBuilder<A, B> &other) { return append(QString(other)); }